

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O3

AggregateFunctionSet * duckdb::ModeFun::GetFunctions(void)

{
  AggregateFunctionSet *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_1b1;
  LogicalType local_1b0;
  LogicalType local_198;
  vector<duckdb::LogicalType,_true> local_180;
  string local_168;
  AggregateFunction local_148;
  
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"mode","");
  AggregateFunctionSet::AggregateFunctionSet(in_RDI,&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  LogicalType::LogicalType(&local_198,ANY);
  __l._M_len = 1;
  __l._M_array = &local_198;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_180,__l,
             &local_1b1);
  LogicalType::LogicalType(&local_1b0,ANY);
  AggregateFunction::AggregateFunction
            (&local_148,&local_180,&local_1b0,(aggregate_size_t)0x0,(aggregate_initialize_t)0x0,
             (aggregate_update_t)0x0,(aggregate_combine_t)0x0,(aggregate_finalize_t)0x0,
             (aggregate_simple_update_t)0x0,BindModeAggregate,(aggregate_destructor_t)0x0,
             (aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
             (aggregate_deserialize_t)0x0);
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&(in_RDI->super_FunctionSet<duckdb::AggregateFunction>).functions.
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_148);
  local_148.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_02433f70;
  if (local_148.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_148.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_1b0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_180);
  LogicalType::~LogicalType(&local_198);
  return in_RDI;
}

Assistant:

AggregateFunctionSet ModeFun::GetFunctions() {
	AggregateFunctionSet mode("mode");
	mode.AddFunction(AggregateFunction({LogicalTypeId::ANY}, LogicalTypeId::ANY, nullptr, nullptr, nullptr, nullptr,
	                                   nullptr, nullptr, BindModeAggregate));
	return mode;
}